

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfRequestPub.c
# Opt level: O1

sbfRequestImpl *
sbfRequestPub_send(sbfRequestPub_conflict pub,void *data,size_t size,sbfRequestPubReplyCb replyCb,
                  void *closure)

{
  sbfRequestTree *psVar1;
  sbfRequestImpl *psVar2;
  uint uVar3;
  sbfRequestImpl *psVar4;
  long lVar5;
  long lVar6;
  sbfRequestImpl *psVar7;
  sbfRequestImpl *psVar8;
  sbfRequestImpl *psVar9;
  sbfRequestImpl *psVar10;
  anon_struct_32_4_548b78d9_for_mTreeEntry *paVar11;
  sbfGuid *psVar12;
  
  if ((pub->mPubReady == 0) || (pub->mSubReady == 0)) {
    psVar4 = (sbfRequestImpl *)0x0;
  }
  else {
    psVar4 = (sbfRequestImpl *)sbfMemory_calloc(1,0x68);
    psVar4->mPub = pub;
    (psVar4->mRefCount).mRefCount = 1;
    psVar4->mReplyCb = replyCb;
    psVar4->mClosure = closure;
    sbfGuid_increment(&pub->mNext,1);
    psVar12 = &psVar4->mGuid;
    sbfGuid_copy(psVar12,&pub->mNext);
    psVar7 = (pub->mRequests).rbh_root;
    if (psVar7 == (sbfRequestImpl *)0x0) {
      lVar6 = 0x50;
      psVar8 = (sbfRequestImpl *)0x0;
    }
    else {
      do {
        psVar8 = psVar7;
        uVar3 = sbfGuid_compare(psVar12,&psVar8->mGuid);
        if ((int)uVar3 < 0) {
          lVar6 = 0x48;
        }
        else {
          lVar6 = 0x50;
          if (uVar3 == 0) goto LAB_00101974;
        }
        psVar7 = *(sbfRequestImpl **)((long)(psVar8->mGuid).mParts + lVar6 + -0x10);
      } while (psVar7 != (sbfRequestImpl *)0x0);
      lVar6 = (ulong)(~uVar3 >> 0x1f) * 8 + 0x48;
    }
    psVar1 = &pub->mRequests;
    (psVar4->mTreeEntry).rbe_parent = psVar8;
    (psVar4->mTreeEntry).rbe_left = (sbfRequestImpl *)0x0;
    (psVar4->mTreeEntry).rbe_right = (sbfRequestImpl *)0x0;
    (psVar4->mTreeEntry).rbe_color = 1;
    if (psVar8 == (sbfRequestImpl *)0x0) {
      psVar1->rbh_root = psVar4;
    }
    else {
      *(sbfRequestImpl **)((long)(psVar8->mGuid).mParts + lVar6 + -0x10) = psVar4;
      psVar7 = psVar4;
      do {
        if ((psVar8->mTreeEntry).rbe_color != 1) break;
        psVar2 = (psVar8->mTreeEntry).rbe_parent;
        psVar9 = (psVar2->mTreeEntry).rbe_left;
        if (psVar8 == psVar9) {
          psVar9 = (psVar2->mTreeEntry).rbe_right;
          if ((psVar9 == (sbfRequestImpl *)0x0) || ((psVar9->mTreeEntry).rbe_color != 1)) {
            psVar9 = (psVar8->mTreeEntry).rbe_right;
            psVar10 = psVar8;
            if (psVar9 == psVar7) {
              psVar10 = (psVar9->mTreeEntry).rbe_left;
              (psVar8->mTreeEntry).rbe_right = psVar10;
              if (psVar10 != (sbfRequestImpl *)0x0) {
                (psVar10->mTreeEntry).rbe_parent = psVar8;
              }
              psVar10 = (psVar8->mTreeEntry).rbe_parent;
              (psVar9->mTreeEntry).rbe_parent = psVar10;
              paVar11 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)psVar1;
              if (psVar10 != (sbfRequestImpl *)0x0) {
                psVar10 = (psVar8->mTreeEntry).rbe_parent;
                paVar11 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)
                          &(psVar10->mTreeEntry).rbe_right;
                if (psVar8 == (psVar10->mTreeEntry).rbe_left) {
                  paVar11 = &psVar10->mTreeEntry;
                }
              }
              paVar11->rbe_left = psVar9;
              (psVar9->mTreeEntry).rbe_left = psVar8;
              (psVar8->mTreeEntry).rbe_parent = psVar9;
              psVar10 = psVar7;
              psVar7 = psVar8;
            }
            (psVar10->mTreeEntry).rbe_color = 0;
            (psVar2->mTreeEntry).rbe_color = 1;
            psVar8 = (psVar2->mTreeEntry).rbe_left;
            psVar9 = (psVar8->mTreeEntry).rbe_right;
            (psVar2->mTreeEntry).rbe_left = psVar9;
            if (psVar9 != (sbfRequestImpl *)0x0) {
              (psVar9->mTreeEntry).rbe_parent = psVar2;
            }
            psVar9 = (psVar2->mTreeEntry).rbe_parent;
            (psVar8->mTreeEntry).rbe_parent = psVar9;
            paVar11 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)psVar1;
            if (psVar9 != (sbfRequestImpl *)0x0) {
              psVar9 = (psVar2->mTreeEntry).rbe_parent;
              paVar11 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar9->mTreeEntry).rbe_right;
              if (psVar2 == (psVar9->mTreeEntry).rbe_left) {
                paVar11 = &psVar9->mTreeEntry;
              }
            }
            paVar11->rbe_left = psVar8;
            (psVar8->mTreeEntry).rbe_right = psVar2;
            goto LAB_00101950;
          }
LAB_001017f1:
          (psVar9->mTreeEntry).rbe_color = 0;
          (psVar8->mTreeEntry).rbe_color = 0;
          (psVar2->mTreeEntry).rbe_color = 1;
          psVar7 = psVar2;
        }
        else {
          if ((psVar9 != (sbfRequestImpl *)0x0) && ((psVar9->mTreeEntry).rbe_color == 1))
          goto LAB_001017f1;
          psVar9 = (psVar8->mTreeEntry).rbe_left;
          psVar10 = psVar8;
          if (psVar9 == psVar7) {
            psVar10 = (psVar9->mTreeEntry).rbe_right;
            (psVar8->mTreeEntry).rbe_left = psVar10;
            if (psVar10 != (sbfRequestImpl *)0x0) {
              (psVar10->mTreeEntry).rbe_parent = psVar8;
            }
            psVar10 = (psVar8->mTreeEntry).rbe_parent;
            (psVar9->mTreeEntry).rbe_parent = psVar10;
            paVar11 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)psVar1;
            if (psVar10 != (sbfRequestImpl *)0x0) {
              psVar10 = (psVar8->mTreeEntry).rbe_parent;
              paVar11 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar10->mTreeEntry).rbe_right
              ;
              if (psVar8 == (psVar10->mTreeEntry).rbe_left) {
                paVar11 = &psVar10->mTreeEntry;
              }
            }
            paVar11->rbe_left = psVar9;
            (psVar9->mTreeEntry).rbe_right = psVar8;
            (psVar8->mTreeEntry).rbe_parent = psVar9;
            psVar10 = psVar7;
            psVar7 = psVar8;
          }
          (psVar10->mTreeEntry).rbe_color = 0;
          (psVar2->mTreeEntry).rbe_color = 1;
          psVar8 = (psVar2->mTreeEntry).rbe_right;
          psVar9 = (psVar8->mTreeEntry).rbe_left;
          (psVar2->mTreeEntry).rbe_right = psVar9;
          if (psVar9 != (sbfRequestImpl *)0x0) {
            (psVar9->mTreeEntry).rbe_parent = psVar2;
          }
          psVar9 = (psVar2->mTreeEntry).rbe_parent;
          (psVar8->mTreeEntry).rbe_parent = psVar9;
          paVar11 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)psVar1;
          if (psVar9 != (sbfRequestImpl *)0x0) {
            psVar9 = (psVar2->mTreeEntry).rbe_parent;
            paVar11 = (anon_struct_32_4_548b78d9_for_mTreeEntry *)&(psVar9->mTreeEntry).rbe_right;
            if (psVar2 == (psVar9->mTreeEntry).rbe_left) {
              paVar11 = &psVar9->mTreeEntry;
            }
          }
          paVar11->rbe_left = psVar8;
          (psVar8->mTreeEntry).rbe_left = psVar2;
LAB_00101950:
          (psVar2->mTreeEntry).rbe_parent = psVar8;
        }
        psVar8 = (psVar7->mTreeEntry).rbe_parent;
      } while (psVar8 != (sbfRequestImpl *)0x0);
    }
    (psVar1->rbh_root->mTreeEntry).rbe_color = 0;
LAB_00101974:
    lVar5 = sbfPub_getBuffer(pub->mPub,size + 0x40);
    lVar6 = *(long *)(lVar5 + 8);
    sbfGuid_copy(lVar6,psVar12);
    *(undefined8 *)(lVar6 + 0x30) = 0;
    *(undefined8 *)(lVar6 + 0x38) = 0;
    *(undefined8 *)(lVar6 + 0x20) = 0;
    *(undefined8 *)(lVar6 + 0x28) = 0;
    memcpy((void *)(lVar6 + 0x40),data,size);
    sbfPub_sendBuffer(pub->mPub,lVar5);
  }
  return psVar4;
}

Assistant:

sbfRequest
sbfRequestPub_send (sbfRequestPub pub,
                    void* data,
                    size_t size,
                    sbfRequestPubReplyCb replyCb,
                    void* closure)
{
    sbfRequest        req;
    sbfBuffer         buffer;
    sbfRequestHeader* hdr;

    if (!pub->mPubReady || !pub->mSubReady)
        return NULL;

    req = xcalloc (1, sizeof *req);
    req->mPub = pub;
    sbfRefCount_init (&req->mRefCount, 1);

    req->mReplyCb = replyCb;
    req->mClosure = closure;

    sbfGuid_increment (&pub->mNext, 1);
    sbfGuid_copy (&req->mGuid, &pub->mNext);

    RB_INSERT (sbfRequestTreeImpl, &pub->mRequests, req);

    buffer = sbfPub_getBuffer (pub->mPub, size + sizeof *hdr);

    hdr = sbfBuffer_getData (buffer);
    sbfGuid_copy (&hdr->mGuid, &req->mGuid);
    memset (hdr->mSpace, 0, sizeof hdr->mSpace);

    memcpy (hdr + 1, data, size);
    sbfPub_sendBuffer (pub->mPub, buffer);

    return req;
}